

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5StructureDecode(u8 *pData,int nData,int *piCookie,Fts5Structure **ppOut)

{
  u32 uVar1;
  u8 *puVar2;
  u32 uVar3;
  Fts5Structure **ppFVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Fts5StructureSegment *pFVar11;
  Fts5StructureLevel *pFVar12;
  long lVar13;
  int *piVar14;
  u32 *v;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  int nTotal;
  int nLevel;
  int local_94;
  u32 local_90;
  u32 local_8c;
  uint local_88;
  int local_84;
  u8 *local_80;
  int local_78;
  u32 local_74;
  Fts5Structure **local_70;
  ulong local_68;
  Fts5StructureLevel *local_60;
  Fts5Structure *local_58;
  ulong local_50;
  ulong local_48;
  Fts5StructureLevel *local_40;
  ulong local_38;
  
  local_94 = 0;
  local_74 = 0;
  local_8c = 0;
  if (piCookie != (int *)0x0) {
    uVar6 = *(uint *)pData;
    *piCookie = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  }
  local_84 = nData;
  local_70 = ppOut;
  uVar6 = sqlite3Fts5GetVarint32(pData + 4,&local_74);
  iVar7 = sqlite3Fts5GetVarint32(pData + (ulong)uVar6 + 4,&local_8c);
  uVar3 = local_74;
  uVar1 = local_8c;
  uVar16 = (ulong)(int)local_74;
  iVar10 = 0x10b;
  if (local_8c < 0x7d1 && uVar16 < 0x7d1) {
    local_80 = pData;
    local_58 = (Fts5Structure *)sqlite3Fts5MallocZero(&local_94,(uVar16 - 1) * 0x10 + 0x28);
    if (local_58 == (Fts5Structure *)0x0) {
      local_58 = (Fts5Structure *)0x0;
    }
    else {
      uVar6 = iVar7 + uVar6 + 4;
      local_58->nRef = 1;
      local_58->nLevel = uVar3;
      local_58->nSegment = uVar1;
      bVar5 = sqlite3Fts5GetVarint(local_80 + uVar6,&local_58->nWriteCounter);
      local_88 = local_8c;
      bVar17 = local_94 == 0;
      if (0 < (int)uVar3 && bVar17) {
        iVar7 = uVar6 + bVar5;
        local_40 = local_58->aLevel;
        local_50 = uVar16 - 1 & 0xffffffff;
        uVar15 = 0;
        iVar10 = local_84;
        local_68 = uVar16;
        do {
          puVar2 = local_80;
          pFVar12 = local_40 + uVar15;
          local_90 = 0;
          local_60 = pFVar12;
          if (iVar7 < iVar10) {
            iVar8 = sqlite3Fts5GetVarint32(local_80 + iVar7,(u32 *)pFVar12);
            iVar9 = sqlite3Fts5GetVarint32(puVar2 + (iVar8 + iVar7),&local_90);
            uVar1 = local_90;
            if ((int)local_90 < pFVar12->nMerge) {
              local_94 = 0x10b;
            }
            iVar7 = iVar8 + iVar7 + iVar9;
            pFVar11 = (Fts5StructureSegment *)
                      sqlite3Fts5MallocZero(&local_94,(long)(int)local_90 * 0xc);
            local_60->aSeg = pFVar11;
            local_88 = local_88 - uVar1;
            uVar16 = local_68;
          }
          else {
            local_94 = 0x10b;
          }
          if (local_94 == 0) {
            uVar16 = (ulong)(int)local_90;
            local_60->nSeg = local_90;
            pFVar12 = local_60;
            iVar8 = local_94;
            local_48 = uVar15;
            if (0 < (long)uVar16) {
              lVar13 = 8;
              uVar15 = 1;
              local_38 = uVar16;
              do {
                puVar2 = local_80;
                if (iVar7 < iVar10) {
                  pFVar11 = pFVar12->aSeg;
                  local_78 = iVar8;
                  iVar10 = sqlite3Fts5GetVarint32
                                     (local_80 + iVar7,(u32 *)((long)pFVar11 + lVar13 + -8));
                  piVar14 = (int *)((long)&pFVar11->iSegid + lVar13);
                  v = (u32 *)(piVar14 + -1);
                  iVar8 = sqlite3Fts5GetVarint32(puVar2 + (iVar10 + iVar7),v);
                  iVar8 = iVar10 + iVar7 + iVar8;
                  iVar7 = sqlite3Fts5GetVarint32
                                    (puVar2 + iVar8,(u32 *)((long)&pFVar11->iSegid + lVar13));
                  iVar7 = iVar8 + iVar7;
                  iVar9 = *piVar14;
                  uVar1 = *v;
                  bVar17 = (int)uVar1 <= iVar9;
                  uVar16 = local_38;
                  pFVar12 = local_60;
                  iVar10 = local_84;
                  iVar8 = local_78;
                  if (iVar9 < (int)uVar1) {
                    iVar8 = 0x10b;
                  }
                }
                else {
                  bVar17 = false;
                  iVar8 = 0x10b;
                }
                if (!bVar17) break;
                lVar13 = lVar13 + 0xc;
                bVar17 = uVar15 < uVar16;
                uVar15 = uVar15 + 1;
              } while (bVar17);
            }
            local_94 = iVar8;
            if (((local_48 != 0) && ((int)uVar16 == 0)) && ((u32)*(u64 *)(pFVar12 + -1) != 0)) {
              local_94 = 0x10b;
            }
            uVar15 = local_48;
            uVar16 = local_68;
            if ((local_48 == local_50) && (pFVar12->nMerge != 0)) {
              local_94 = 0x10b;
            }
          }
          bVar17 = local_94 == 0;
        } while ((bVar17) && (uVar15 = uVar15 + 1, uVar15 < uVar16));
      }
      ppFVar4 = local_70;
      local_8c = local_88;
      if ((bVar17) && (local_88 != 0)) {
        local_94 = 0x10b;
      }
      local_70 = ppFVar4;
      if (local_94 != 0) {
        fts5StructureRelease(local_58);
        local_58 = (Fts5Structure *)0x0;
        local_70 = ppFVar4;
      }
    }
    *local_70 = local_58;
    iVar10 = local_94;
  }
  return iVar10;
}

Assistant:

static int fts5StructureDecode(
  const u8 *pData,                /* Buffer containing serialized structure */
  int nData,                      /* Size of buffer pData in bytes */
  int *piCookie,                  /* Configuration cookie value */
  Fts5Structure **ppOut           /* OUT: Deserialized object */
){
  int rc = SQLITE_OK;
  int i = 0;
  int iLvl;
  int nLevel = 0;
  int nSegment = 0;
  sqlite3_int64 nByte;            /* Bytes of space to allocate at pRet */
  Fts5Structure *pRet = 0;        /* Structure object to return */

  /* Grab the cookie value */
  if( piCookie ) *piCookie = sqlite3Fts5Get32(pData);
  i = 4;

  /* Read the total number of levels and segments from the start of the
  ** structure record.  */
  i += fts5GetVarint32(&pData[i], nLevel);
  i += fts5GetVarint32(&pData[i], nSegment);
  if( nLevel>FTS5_MAX_SEGMENT   || nLevel<0
   || nSegment>FTS5_MAX_SEGMENT || nSegment<0
  ){
    return FTS5_CORRUPT;
  }
  nByte = (
      sizeof(Fts5Structure) +                    /* Main structure */
      sizeof(Fts5StructureLevel) * (nLevel-1)    /* aLevel[] array */
  );
  pRet = (Fts5Structure*)sqlite3Fts5MallocZero(&rc, nByte);

  if( pRet ){
    pRet->nRef = 1;
    pRet->nLevel = nLevel;
    pRet->nSegment = nSegment;
    i += sqlite3Fts5GetVarint(&pData[i], &pRet->nWriteCounter);

    for(iLvl=0; rc==SQLITE_OK && iLvl<nLevel; iLvl++){
      Fts5StructureLevel *pLvl = &pRet->aLevel[iLvl];
      int nTotal = 0;
      int iSeg;

      if( i>=nData ){
        rc = FTS5_CORRUPT;
      }else{
        i += fts5GetVarint32(&pData[i], pLvl->nMerge);
        i += fts5GetVarint32(&pData[i], nTotal);
        if( nTotal<pLvl->nMerge ) rc = FTS5_CORRUPT;
        pLvl->aSeg = (Fts5StructureSegment*)sqlite3Fts5MallocZero(&rc, 
            nTotal * sizeof(Fts5StructureSegment)
        );
        nSegment -= nTotal;
      }

      if( rc==SQLITE_OK ){
        pLvl->nSeg = nTotal;
        for(iSeg=0; iSeg<nTotal; iSeg++){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          if( i>=nData ){
            rc = FTS5_CORRUPT;
            break;
          }
          i += fts5GetVarint32(&pData[i], pSeg->iSegid);
          i += fts5GetVarint32(&pData[i], pSeg->pgnoFirst);
          i += fts5GetVarint32(&pData[i], pSeg->pgnoLast);
          if( pSeg->pgnoLast<pSeg->pgnoFirst ){
            rc = FTS5_CORRUPT;
            break;
          }
        }
        if( iLvl>0 && pLvl[-1].nMerge && nTotal==0 ) rc = FTS5_CORRUPT;
        if( iLvl==nLevel-1 && pLvl->nMerge ) rc = FTS5_CORRUPT;
      }
    }
    if( nSegment!=0 && rc==SQLITE_OK ) rc = FTS5_CORRUPT;

    if( rc!=SQLITE_OK ){
      fts5StructureRelease(pRet);
      pRet = 0;
    }
  }

  *ppOut = pRet;
  return rc;
}